

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

int __thiscall
cnn::LookupParameters::copy(LookupParameters *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = (this->dim).nd;
  if ((uVar1 == *(uint *)(dst + 0x24)) && ((this->dim).bd == *(uint *)(dst + 0x28))) {
    uVar1 = bcmp(&this->dim,dst + 8,(ulong)uVar1);
    uVar2 = (ulong)uVar1;
    if (uVar1 == 0) {
      lVar3 = *(long *)(dst + 0x30);
      if (*(long *)(dst + 0x38) != lVar3) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          TensorTools::CopyElements
                    ((Tensor *)
                     ((long)(((this->values).
                              super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                              super__Vector_impl_data._M_start)->d).d + lVar5),
                     (Tensor *)(lVar3 + lVar5));
          uVar4 = uVar4 + 1;
          lVar3 = *(long *)(dst + 0x30);
          uVar2 = (*(long *)(dst + 0x38) - lVar3 >> 3) * -0x71c71c71c71c71c7;
          lVar5 = lVar5 + 0x48;
        } while (uVar4 < uVar2);
      }
      return (int)uVar2;
    }
  }
  __assert_fail("dim == param.dim",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.cc"
                ,0x8d,"void cnn::LookupParameters::copy(const LookupParameters &)");
}

Assistant:

void LookupParameters::scale_parameters(float a) {
  for (auto& p : values)
    (*p) *= a;
}